

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

BlockEventExpressionSyntax * __thiscall
slang::parsing::Parser::parseBlockEventExpression(Parser *this)

{
  Token keyword_00;
  bool bVar1;
  ParserBase *in_RDI;
  Token TVar2;
  BlockEventExpressionSyntax *right;
  Token op;
  PrimaryBlockEventExpressionSyntax *left;
  NameSyntax *name;
  Token keyword;
  undefined6 in_stack_ffffffffffffff60;
  undefined2 in_stack_ffffffffffffff66;
  undefined6 in_stack_ffffffffffffff68;
  TokenKind in_stack_ffffffffffffff6e;
  ParserBase *in_stack_ffffffffffffff70;
  ParserBase *in_stack_ffffffffffffff80;
  Parser *local_48;
  Parser *local_38;
  TokenKind local_30;
  undefined8 in_stack_ffffffffffffffe8;
  TokenKind kind;
  ParserBase *this_00;
  BinaryBlockEventExpressionSyntax *local_8;
  
  kind = (TokenKind)((ulong)in_stack_ffffffffffffffe8 >> 0x30);
  this_00 = in_RDI;
  Token::Token((Token *)CONCAT26(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60));
  TVar2 = ParserBase::peek(in_RDI);
  local_30 = TVar2.kind;
  if ((local_30 == BeginKeyword) || (local_30 == EndKeyword)) {
    TVar2 = ParserBase::consume(in_stack_ffffffffffffff80);
    local_38 = (Parser *)TVar2.info;
  }
  else {
    TVar2 = ParserBase::expect(this_00,kind);
    local_48 = (Parser *)TVar2.info;
    local_38 = local_48;
  }
  parseName((Parser *)CONCAT26(local_30,in_stack_ffffffffffffff60));
  keyword_00.rawLen._2_2_ = in_stack_ffffffffffffff6e;
  keyword_00._0_6_ = in_stack_ffffffffffffff68;
  keyword_00.info = (Info *)in_stack_ffffffffffffff70;
  local_8 = (BinaryBlockEventExpressionSyntax *)
            slang::syntax::SyntaxFactory::primaryBlockEventExpression
                      ((SyntaxFactory *)CONCAT26(local_30,in_stack_ffffffffffffff60),keyword_00,
                       (NameSyntax *)in_RDI);
  bVar1 = ParserBase::peek(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6e);
  if (bVar1) {
    TVar2 = ParserBase::consume(in_stack_ffffffffffffff80);
    parseBlockEventExpression(local_38);
    local_8 = slang::syntax::SyntaxFactory::binaryBlockEventExpression
                        ((SyntaxFactory *)CONCAT26(local_30,in_stack_ffffffffffffff60),
                         (BlockEventExpressionSyntax *)in_RDI,TVar2,
                         (BlockEventExpressionSyntax *)0x31166b);
  }
  return &local_8->super_BlockEventExpressionSyntax;
}

Assistant:

BlockEventExpressionSyntax& Parser::parseBlockEventExpression() {
    Token keyword;
    switch (peek().kind) {
        case TokenKind::BeginKeyword:
        case TokenKind::EndKeyword:
            keyword = consume();
            break;
        default:
            keyword = expect(TokenKind::BeginKeyword);
            break;
    }

    auto& name = parseName();
    auto& left = factory.primaryBlockEventExpression(keyword, name);

    if (peek(TokenKind::OrKeyword)) {
        auto op = consume();
        auto& right = parseBlockEventExpression();
        return factory.binaryBlockEventExpression(left, op, right);
    }
    return left;
}